

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTaskManager.hpp
# Opt level: O2

void __thiscall sftm::CTaskManager::Start(CTaskManager *this,uint32_t nInitWorkers)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  
  uVar1 = 0x3f;
  if (nInitWorkers < 0x41) {
    uVar1 = (ulong)nInitWorkers;
  }
  this->m_nWorkerCount = (uint32_t)uVar1;
  for (lVar2 = 0; uVar1 * 0x1030 + 0x1030 != lVar2; lVar2 = lVar2 + 0x1030) {
    *(CTaskManager **)((long)(this->m_workers)._M_elems[0].m_taskQueue.m_pItems + lVar2 + -0x28) =
         this;
    *(uint32_t *)((long)(this->m_workers)._M_elems[0].m_taskQueue.m_pItems + lVar2 + -0x20) =
         (uint32_t)uVar1;
    *(condition_variable **)
     ((long)(this->m_workers)._M_elems[0].m_taskQueue.m_pItems + lVar2 + -0x18) =
         &this->m_cvWorkerIdle;
    *(mutex **)((long)(this->m_workers)._M_elems[0].m_taskQueue.m_pItems + lVar2 + -0x10) =
         &this->m_mtxWorkerIdle;
  }
  while( true ) {
    this = (CTaskManager *)((this->m_workers)._M_elems + 1);
    bVar3 = uVar1 == 0;
    uVar1 = uVar1 - 1;
    if (bVar3) break;
    CWorker::Start((CWorker *)this);
  }
  return;
}

Assistant:

void Start(std::uint32_t nInitWorkers) noexcept
		{
			if (nInitWorkers > MAX_WORKERS)
				nInitWorkers = MAX_WORKERS - 1;
			m_nWorkerCount = nInitWorkers;

			for (std::uint32_t nWorker = 0; nWorker <= nInitWorkers; nWorker++)
			{
				m_workers[nWorker].m_ownerData.m_pWorkers		= &m_workers[0];
				m_workers[nWorker].m_ownerData.m_nWorkerCount	= nInitWorkers;
				m_workers[nWorker].m_ownerData.m_pCvWorkerIdle	= &m_cvWorkerIdle;
				m_workers[nWorker].m_ownerData.m_pMutWorkerIdle = &m_mtxWorkerIdle;
			}

			for (std::uint32_t nWorker = 1; nWorker <= nInitWorkers; nWorker++)
			{
				m_workers[nWorker].Start();
			}
		}